

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void pdqsort_detail::
     swap_offsets<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
               (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                first,__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      last,uchar *offsets_l,uchar *offsets_r,size_t num,bool use_swaps)

{
  undefined8 *puVar1;
  byte bVar2;
  double dVar3;
  FractionalInteger *this;
  undefined3 in_register_00000089;
  size_t i;
  size_t sVar4;
  size_t i_1;
  FractionalInteger local_68;
  
  if (CONCAT31(in_register_00000089,use_swaps) == 0) {
    if (num != 0) {
      bVar2 = *offsets_l;
      this = last._M_current + -(ulong)*offsets_r;
      local_68.fractionality = first._M_current[bVar2].fractionality;
      dVar3 = first._M_current[bVar2].row_ep_norm2;
      puVar1 = (undefined8 *)((long)&first._M_current[bVar2].row_ep_norm2 + 4);
      local_68._20_8_ = puVar1[1];
      local_68.score._0_4_ = (undefined4)((ulong)*puVar1 >> 0x20);
      local_68.row_ep_norm2._0_4_ = SUB84(dVar3,0);
      local_68.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar3 >> 0x20);
      local_68.row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start =
           first._M_current[bVar2].row_ep.
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_68.row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish =
           first._M_current[bVar2].row_ep.
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_68.row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           first._M_current[bVar2].row_ep.
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      first._M_current[bVar2].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      first._M_current[bVar2].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      first._M_current[bVar2].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      FractionalInteger::operator=(first._M_current + bVar2,this);
      for (sVar4 = 1; num != sVar4; sVar4 = sVar4 + 1) {
        bVar2 = offsets_l[sVar4];
        FractionalInteger::operator=(this,first._M_current + bVar2);
        this = last._M_current + -(ulong)offsets_r[sVar4];
        FractionalInteger::operator=(first._M_current + bVar2,this);
      }
      FractionalInteger::operator=(this,&local_68);
      std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      ~_Vector_base(&local_68.row_ep.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   );
    }
  }
  else {
    for (sVar4 = 0; num != sVar4; sVar4 = sVar4 + 1) {
      std::swap<FractionalInteger>
                (first._M_current + offsets_l[sVar4],last._M_current + -(ulong)offsets_r[sVar4]);
    }
  }
  return;
}

Assistant:

inline void swap_offsets(Iter first, Iter last,
                             unsigned char* offsets_l, unsigned char* offsets_r,
                             size_t num, bool use_swaps) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (use_swaps) {
            // This case is needed for the descending distribution, where we need
            // to have proper swapping for pdqsort to remain O(n).
            for (size_t i = 0; i < num; ++i) {
                std::iter_swap(first + offsets_l[i], last - offsets_r[i]);
            }
        } else if (num > 0) {
            Iter l = first + offsets_l[0]; Iter r = last - offsets_r[0];
            T tmp(PDQSORT_PREFER_MOVE(*l)); *l = PDQSORT_PREFER_MOVE(*r);
            for (size_t i = 1; i < num; ++i) {
                l = first + offsets_l[i]; *r = PDQSORT_PREFER_MOVE(*l);
                r = last - offsets_r[i]; *l = PDQSORT_PREFER_MOVE(*r);
            }
            *r = PDQSORT_PREFER_MOVE(tmp);
        }
    }